

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmath.c
# Opt level: O0

double * xvm_new(uint64_t N)

{
  double *pdVar1;
  int iVar2;
  ulong in_RDI;
  void *ptr;
  ulong local_28;
  double *local_20;
  undefined8 local_18;
  size_t local_10;
  double *local_8;
  
  local_28 = in_RDI;
  if ((in_RDI & 3) != 0) {
    local_28 = (4 - (in_RDI & 3)) + in_RDI;
  }
  local_10 = local_28 << 3;
  local_18 = 0x10;
  iVar2 = posix_memalign(&local_20,0x10,local_10);
  if (iVar2 == 0) {
    local_8 = local_20;
  }
  else {
    local_8 = (double *)0x0;
  }
  pdVar1 = local_8;
  if (local_8 == (double *)0x0) {
    fatal("out of memory");
  }
  return pdVar1;
}

Assistant:

double *xvm_new(uint64_t N) {
#if defined(__SSE2__) && !defined(XVM_ANSI)
	if (N % 4 != 0)
		N += 4 - N % 4;
	void *ptr = _mm_malloc(sizeof(double) * N, 16);
	if (ptr == NULL)
		fatal("out of memory");
	return ptr;
#else
	return xmalloc(sizeof(double) * N);
#endif
}